

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O3

char * test_matrix4_transformation_translatev3_negative(void)

{
  int iVar1;
  char *pcVar2;
  vector3 expectedPosition;
  vector3 translation;
  vector3 startingPosition;
  matrix4 transform;
  anon_union_24_3_07544b15_for_vector3_0 local_f8;
  anon_union_24_3_07544b15_for_vector3_0 local_d8;
  anon_union_24_3_07544b15_for_vector3_0 local_b8;
  matrix4 local_a0;
  
  local_b8.v[0] = 0.0;
  local_b8.v[1] = 1.0;
  local_b8.v[2] = 0.0;
  local_d8.v[0] = -0.10000000149011612;
  local_d8.v[1] = -0.10000000149011612;
  local_d8.v[2] = -0.10000000149011612;
  local_f8.v[0] = -0.10000000149011612;
  local_f8.v[1] = 0.8999999761581421;
  local_f8.v[2] = -0.10000000149011612;
  matrix4_make_transformation_translationv3(&local_a0,(vector3 *)&local_d8.field_1);
  vector3_multiplym4((vector3 *)&local_b8.field_1,&local_a0);
  iVar1 = vector3_equals((vector3 *)&local_b8.field_1,(vector3 *)&local_f8.field_1);
  pcVar2 = 
  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(264) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
  ;
  if (iVar1 != 0) {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static char *test_matrix4_transformation_translatev3_negative(void)
{
	struct matrix4 transform;

	struct vector3 startingPosition = {0.0f, 1.0f, 0.0f};
	struct vector3 translation = {-0.1f, -0.1f, -0.1f};
	struct vector3 expectedPosition = {-0.1f, 0.9f, -0.1f};

	matrix4_make_transformation_translationv3(&transform, &translation);
	vector3_multiplym4(&startingPosition, &transform);
	test_assert(vector3_equals(&startingPosition, &expectedPosition));

	return NULL;
}